

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setSignificantDigitsUsed(DecimalFormat *this,UBool useSignificantDigits)

{
  DecimalFormatProperties *pDVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t maxSig;
  int32_t minSig;
  UBool useSignificantDigits_local;
  DecimalFormat *this_local;
  
  if (useSignificantDigits == '\0') {
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    if ((pDVar1->minimumSignificantDigits == -1) &&
       (pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                           ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                            this->fields), pDVar1->maximumSignificantDigits == -1)) {
      return;
    }
  }
  else {
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    if (pDVar1->minimumSignificantDigits != -1) {
      return;
    }
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    if (pDVar1->maximumSignificantDigits != -1) {
      return;
    }
  }
  iVar2 = -1;
  if (useSignificantDigits != '\0') {
    iVar2 = 1;
  }
  iVar3 = -1;
  if (useSignificantDigits != '\0') {
    iVar3 = 6;
  }
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  pDVar1->minimumSignificantDigits = iVar2;
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  pDVar1->maximumSignificantDigits = iVar3;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setSignificantDigitsUsed(UBool useSignificantDigits) {
    // These are the default values from the old implementation.
    if (useSignificantDigits) {
        if (fields->properties->minimumSignificantDigits != -1 ||
            fields->properties->maximumSignificantDigits != -1) {
            return;
        }
    } else {
        if (fields->properties->minimumSignificantDigits == -1 &&
            fields->properties->maximumSignificantDigits == -1) {
            return;
        }
    }
    int32_t minSig = useSignificantDigits ? 1 : -1;
    int32_t maxSig = useSignificantDigits ? 6 : -1;
    fields->properties->minimumSignificantDigits = minSig;
    fields->properties->maximumSignificantDigits = maxSig;
    touchNoError();
}